

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O3

Slice * __thiscall
Imf_2_5::SampleCountChannel::slice(Slice *__return_storage_ptr__,SampleCountChannel *this)

{
  int ysm;
  
  ysm = (this->super_ImageChannel)._ySampling;
  Slice::Slice(__return_storage_ptr__,UINT,(char *)this->_base,4,
               (long)(this->super_ImageChannel)._pixelsPerRow << 2,
               (this->super_ImageChannel)._xSampling,ysm,0.0,false,SUB41(ysm,0));
  return __return_storage_ptr__;
}

Assistant:

Slice
SampleCountChannel::slice () const
{
    return Slice (UINT,                                     // type
                  (char *) _base,                           // base
                  sizeof (unsigned int),                    // xStride
                  pixelsPerRow() * sizeof (unsigned int),   // yStride
                  xSampling(),
                  ySampling());
}